

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_spec.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::NamePattern::matches(NamePattern *this,TestCaseInfo *testCase)

{
  bool bVar1;
  Catch local_38 [32];
  TestCaseInfo *local_18;
  TestCaseInfo *testCase_local;
  NamePattern *this_local;
  
  local_18 = testCase;
  testCase_local = (TestCaseInfo *)this;
  toLower(local_38,&testCase->name);
  bVar1 = WildcardPattern::matches(&this->m_wildcardPattern,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

virtual bool matches( TestCaseInfo const& testCase ) const {
                return m_wildcardPattern.matches( toLower( testCase.name ) );
            }